

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O3

Expression __thiscall
cnn::Cluster::neg_log_softmax(Cluster *this,Expression *h,uint r,ComputationGraph *cg)

{
  int iVar1;
  undefined4 in_register_00000014;
  undefined8 *puVar2;
  ComputationGraph *in_R8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  Expression EVar4;
  Expression p;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  pointer local_40;
  undefined4 local_38;
  pointer local_30;
  undefined4 local_28;
  undefined8 uVar3;
  
  puVar2 = (undefined8 *)CONCAT44(in_register_00000014,r);
  iVar1 = *(int *)((long)&h[0xb].pg + 4);
  if (iVar1 == 2) {
    local_30 = (pointer)*puVar2;
    local_28 = *(undefined4 *)(puVar2 + 1);
    predict((Cluster *)local_50,h,(ComputationGraph *)&stack0xffffffffffffffd0);
    expr::logistic((expr *)local_60,(Expression *)local_50);
    __x = extraout_XMM0_Qa;
    if ((uint)cg == 1) {
      expr::operator-((expr *)local_50,1.0,(Expression *)local_60);
      local_60._0_8_ = local_50._0_8_;
      local_60._8_4_ = local_50._8_4_;
      __x = extraout_XMM0_Qa_00;
    }
    expr::log((expr *)local_50,__x);
    EVar4 = expr::operator-((expr *)this,(Expression *)local_50);
    uVar3 = EVar4._8_8_;
  }
  else if (iVar1 == 1) {
    EVar4 = expr::input((expr *)this,in_R8,0.0);
    uVar3 = EVar4._8_8_;
  }
  else {
    local_40 = (pointer)*puVar2;
    local_38 = *(undefined4 *)(puVar2 + 1);
    predict((Cluster *)local_60,h,(ComputationGraph *)&local_40);
    EVar4 = expr::pickneglogsoftmax((expr *)this,(Expression *)local_60,(uint)cg);
    uVar3 = EVar4._8_8_;
  }
  EVar4._8_8_ = uVar3;
  EVar4.pg = (ComputationGraph *)this;
  return EVar4;
}

Assistant:

Expression Cluster::neg_log_softmax(Expression h, unsigned r, ComputationGraph& cg) const {
  if (output_size == 1) {
    return input(cg, 0.0f);
  }
  else if (output_size == 2) {
    Expression p = logistic(predict(h, cg));
    assert (r == 0 || r == 1);
    if (r == 1) {
      p = 1 - p;
    }
    return -log(p);
  }
  else {
    Expression dist = predict(h, cg);
    return pickneglogsoftmax(dist, r);
  }
}